

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  _Prime_rehash_policy *filename;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  ulong *puVar1;
  ulong uVar2;
  pointer ppcVar3;
  pointer ppMVar4;
  MUFile *text;
  cmGeneratorTarget *this_01;
  pointer pQVar5;
  size_t __n;
  pointer pcVar6;
  key_type *pkVar7;
  size_type sVar8;
  bool bVar9;
  bool bVar10;
  FileFormat FVar11;
  int iVar12;
  string *psVar13;
  string *psVar14;
  char *pcVar15;
  _Base_ptr p_Var16;
  cmSourceFile *pcVar17;
  __node_base_ptr p_Var18;
  mapped_type *this_02;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID id;
  ulong uVar19;
  __node_base_ptr extraout_RDX;
  __node_base_ptr extraout_RDX_00;
  __node_base_ptr p_Var20;
  __node_base_ptr extraout_RDX_01;
  __node_base_ptr extraout_RDX_02;
  __node_base_ptr extraout_RDX_03;
  __node_base_ptr extraout_RDX_04;
  __node_base_ptr extraout_RDX_05;
  __node_base_ptr extraout_RDX_06;
  __node_base_ptr extraout_RDX_07;
  __node_base_ptr extraout_RDX_08;
  pointer pbVar21;
  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  *eMuf_1;
  long lVar22;
  pointer pQVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  long lVar24;
  key_type *__rhs;
  pointer pQVar25;
  undefined1 rcc;
  _Hash_node_base *in_R8;
  _Hash_node_base *p_Var26;
  __node_base_ptr p_Var27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  Qrc *qrc_1;
  ulong *puVar29;
  pointer ppcVar30;
  pointer ppMVar31;
  pointer pQVar32;
  iterator __begin3;
  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var33;
  _Alloc_hider _Var34;
  cmMakefile *pcVar35;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar36;
  pair<std::__detail::_Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>,_bool>
  pVar37;
  string pathError;
  string opts;
  MUFileHandle eMuf;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  extraHeaders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  Qrc qrc;
  string qrc_str;
  string AUTOUIC_OPTIONS_str;
  string SKIP_AUTORCC_str;
  string SKIP_AUTOUIC_str;
  string ui_str;
  string SKIP_AUTOGEN_str;
  anon_class_32_4_0bc3998a makeMUFile;
  string AUTORCC_OPTIONS_str;
  string SKIP_AUTOMOC_str;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [32];
  cmMakefile *local_318;
  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_310;
  undefined1 local_308 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  _Base_ptr local_2e0;
  string local_2d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_2b0;
  undefined1 local_2a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  pointer local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_t local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  __node_base local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e0 [24];
  _Alloc_hider local_1c8;
  _Base_ptr local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined2 local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  pointer pbStack_178;
  pointer local_170;
  pointer pbStack_168;
  pointer local_158;
  pointer local_150;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  __node_base_ptr local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  cmGlobalGenerator *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [24];
  pointer local_40 [2];
  
  local_318 = this->Target->Target->Makefile;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"SKIP_AUTOGEN","");
  local_58._8_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 8),"SKIP_AUTOMOC","");
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"SKIP_AUTOUIC","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SKIP_AUTORCC","");
  local_138._M_allocated_capacity = (size_type)&local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_148 + 0x10),"AUTOUIC_OPTIONS","")
  ;
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"AUTORCC_OPTIONS","");
  local_158 = (pointer)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"qrc","");
  local_d8._M_p = (pointer)&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"ui","");
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  local_98._0_8_ = (cmMakefile *)local_b8;
  local_98._8_8_ = this;
  local_88._M_p = (pointer)(local_58 + 8);
  local_80 = (cmGlobalGenerator *)local_f8;
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (this->Target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_2d8);
  sVar8 = local_2d8._M_string_length;
  if (local_2d8._M_dataplus._M_p != (pointer)local_2d8._M_string_length) {
    local_2e0 = (_Base_ptr)&(this->AutogenTarget).FilesGenerated;
    local_310 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&(this->AutogenTarget).Sources;
    local_308._8_8_ = &(this->AutogenTarget).Headers;
    local_2b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &(this->Rcc).Qrcs;
    _Var34._M_p = local_2d8._M_dataplus._M_p;
    do {
      pcVar17 = *(cmSourceFile **)_Var34._M_p;
      local_358._8_8_ = (cmQtAutoGenInitializer *)0x0;
      local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
      local_358._0_8_ = (cmMakefile *)local_348;
      psVar13 = cmSourceFile::GetFullPath(pcVar17,(string *)local_358);
      if (((cmQtAutoGenInitializer *)local_358._8_8_ == (cmQtAutoGenInitializer *)0x0) &&
         (psVar13->_M_string_length != 0)) {
        psVar14 = cmSourceFile::GetExtension_abi_cxx11_(pcVar17);
        if (((this->Moc).super_GenVarsT.Enabled != false) ||
           (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
          FVar11 = cmSystemTools::GetFileFormat(psVar14);
          if (FVar11 == CXX_FILE_FORMAT) {
            in_R8 = (_Hash_node_base *)0x1;
            InitScanFiles::anon_class_32_4_0bc3998a::operator()
                      ((anon_class_32_4_0bc3998a *)(local_348 + 0x10),(cmSourceFile *)local_98,
                       (string *)pcVar17,SUB81(psVar13,0));
            if (((*(bool *)(local_338._0_8_ + 0x2b) != false) ||
                (*(bool *)(local_338._0_8_ + 0x2c) == true)) &&
               (*(bool *)(local_338._0_8_ + 0x28) == true)) {
              local_2a8._0_8_ = local_338._0_8_;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_2e0,(MUFile **)local_2a8);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      (local_310,(cmSourceFile **)(local_338._0_8_ + 0x20),local_348 + 0x10);
          }
          else {
            if (FVar11 != HEADER_FILE_FORMAT) goto LAB_00322687;
            in_R8 = (_Hash_node_base *)0x1;
            InitScanFiles::anon_class_32_4_0bc3998a::operator()
                      ((anon_class_32_4_0bc3998a *)(local_348 + 0x10),(cmSourceFile *)local_98,
                       (string *)pcVar17,SUB81(psVar13,0));
            if (((*(bool *)(local_338._0_8_ + 0x2b) != false) ||
                (*(bool *)(local_338._0_8_ + 0x2c) == true)) &&
               (*(bool *)(local_338._0_8_ + 0x28) == true)) {
              local_2a8._0_8_ = local_338._0_8_;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_2e0,(MUFile **)local_2a8);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_308._8_8_,(cmSourceFile **)(local_338._0_8_ + 0x20),local_348 + 0x10
                      );
          }
          if ((MUFile *)local_338._0_8_ != (MUFile *)0x0) {
            std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                      ((default_delete<cmQtAutoGenInitializer::MUFile> *)(local_348 + 0x10),
                       (MUFile *)local_338._0_8_);
          }
        }
LAB_00322687:
        if ((((this->Rcc).super_GenVarsT.Enabled == true) &&
            (pbVar21 = (pointer)psVar14->_M_string_length, pbVar21 == local_150)) &&
           (((pbVar21 == (pointer)0x0 ||
             (iVar12 = bcmp((psVar14->_M_dataplus)._M_p,local_158,(size_t)pbVar21), iVar12 == 0)) &&
            ((bVar9 = cmSourceFile::GetPropertyAsBool(pcVar17,(string *)local_b8), !bVar9 &&
             (bVar9 = cmSourceFile::GetPropertyAsBool(pcVar17,&local_118), !bVar9)))))) {
          local_2a8._0_8_ = local_2a8 + 0x10;
          local_2a8._8_8_ = (pointer)0x0;
          local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
          local_288._M_allocated_capacity = (size_type)&local_278;
          local_288._8_8_ = (_Base_ptr)0x0;
          local_278._M_local_buf[0] = '\0';
          local_268._M_p = (pointer)&local_258;
          local_260 = (pointer)0x0;
          local_258._M_local_buf[0] = '\0';
          local_248._M_p = (pointer)&local_238;
          local_240 = 0;
          local_238._M_local_buf[0] = '\0';
          local_228._M_p = (pointer)&local_218;
          local_220 = 0;
          local_218._M_local_buf[0] = '\0';
          local_208._M_p = (pointer)&local_1f8;
          local_200._M_nxt = (_Hash_node_base *)0x0;
          local_1f8._M_local_buf[0] = '\0';
          local_1e0._0_4_ = _S_red;
          local_1e0._8_8_ = (_Base_ptr)0x0;
          local_1e0._16_8_ = local_1e0;
          local_1c0 = (_Base_ptr)0x0;
          local_1b8._M_allocated_capacity = (size_type)&local_1a8;
          local_1b8._8_8_ = 0;
          local_1a8._M_local_buf[0] = '\0';
          local_198._0_1_ = false;
          local_198._1_1_ = false;
          local_170 = (pointer)0x0;
          pbStack_168 = (pointer)0x0;
          local_190.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pbStack_178 = (pointer)0x0;
          local_190.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_190.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8._M_p = (pointer)local_1e0._16_8_;
          cmsys::SystemTools::GetRealPath((string *)(local_348 + 0x10),psVar13,(string *)0x0);
          std::__cxx11::string::operator=
                    ((string *)local_288._M_local_buf,(string *)(local_348 + 0x10));
          if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
            operator_delete((void *)local_338._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_338._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          psVar13 = (string *)(local_348 + 0x10);
          cmsys::SystemTools::GetFilenameWithoutLastExtension(psVar13,(string *)&local_288);
          std::__cxx11::string::operator=((string *)&local_268,(string *)psVar13);
          if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
            operator_delete((void *)local_338._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_338._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          local_198._0_1_ = pcVar17->IsGenerated;
          pcVar15 = cmSourceFile::GetSafeProperty(pcVar17,(string *)&local_78);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar13,pcVar15,(allocator<char> *)&local_2f8);
          if ((_Elt_pointer)local_338._8_8_ != (_Elt_pointer)0x0) {
            cmSystemTools::ExpandListArgument(psVar13,&local_190,false);
          }
          if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
            operator_delete((void *)local_338._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_338._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
          emplace_back<cmQtAutoGenInitializer::Qrc>
                    ((vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                      *)local_2b0,(Qrc *)local_2a8);
          Qrc::~Qrc((Qrc *)local_2a8);
        }
      }
      if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
        operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
      }
      _Var34._M_p = _Var34._M_p + 8;
    } while (_Var34._M_p != (pointer)sVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    local_2d8.field_2._M_allocated_capacity - (long)local_2d8._M_dataplus._M_p);
  }
  cmGeneratorTarget::ClearSourcesCache(this->Target);
  if (((this->Moc).super_GenVarsT.Enabled != false) ||
     (id = extraout_EDX, ((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::reserve((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_2f8,(this->AutogenTarget).Sources._M_h._M_element_count * 2);
    local_2a8._0_8_ = local_2a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
    paVar28 = &local_278;
    local_288._M_allocated_capacity = (size_type)paVar28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"_p","");
    local_308._8_8_ = cmMakefile::GetCMakeInstance(local_318);
    p_Var16 = (_Base_ptr)(this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
    if (p_Var16 != (_Base_ptr)0x0) {
      do {
        local_2e0 = p_Var16;
        p_Var16 = p_Var16->_M_left;
        if ((*(char *)((long)&p_Var16[1]._M_parent + 3) != '\0') ||
           (*(char *)((long)&p_Var16[1]._M_parent + 4) == '\x01')) {
          cmQtAutoGen::SubDirPrefix((string *)local_358,(string *)p_Var16);
          cmsys::SystemTools::GetFilenameWithoutLastExtension
                    ((string *)(local_348 + 0x10),(string *)p_Var16);
          std::__cxx11::string::_M_append(local_358,local_338._0_8_);
          if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
            operator_delete((void *)local_338._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_338._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          p_Var33 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     *)0x0;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_348 + 0x10),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_2a8 + (long)p_Var33));
            local_310 = p_Var33;
            puVar1 = (ulong *)(((string *)(local_308._8_8_ + 0x250))->field_2)._M_allocated_capacity
            ;
            for (puVar29 = (ulong *)((string *)(local_308._8_8_ + 0x250))->_M_string_length;
                puVar29 != puVar1; puVar29 = puVar29 + 4) {
              local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d8,local_338._0_8_,
                         (undefined1 *)
                         ((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_338._8_8_)->_M_impl).super__Vector_impl_data._M_start +
                         (long)&(((string *)local_338._0_8_)->_M_dataplus)._M_p));
              bVar9 = SUB81(&local_2d8,0);
              std::__cxx11::string::push_back(bVar9);
              std::__cxx11::string::_M_append((char *)&local_2d8,*puVar29);
              pcVar17 = cmMakefile::GetSource(local_318,&local_2d8,Known);
              if (pcVar17 == (cmSourceFile *)0x0) {
                bVar10 = cmsys::SystemTools::FileExists(&local_2d8);
                if (bVar10) {
                  pcVar17 = cmMakefile::CreateSource(local_318,&local_2d8,false,Known);
                }
LAB_00322bc5:
                if (pcVar17 != (cmSourceFile *)0x0) {
LAB_00322bd8:
                  in_R8 = (_Hash_node_base *)0x1;
                  InitScanFiles::anon_class_32_4_0bc3998a::operator()
                            ((anon_class_32_4_0bc3998a *)local_308,(cmSourceFile *)local_98,
                             (string *)pcVar17,bVar9);
                  if (*(char *)((long)&p_Var16[1]._M_parent + 3) == '\0') {
                    *(bool *)(local_308._0_8_ + 0x2b) = false;
                  }
                  if (*(char *)((long)&p_Var16[1]._M_parent + 4) == '\0') {
                    *(bool *)(local_308._0_8_ + 0x2c) = false;
                  }
                  std::
                  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                  ::
                  emplace_back<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                              *)&local_2f8,
                             (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                              *)local_308);
                  if ((MUFile *)local_308._0_8_ != (MUFile *)0x0) {
                    std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                              ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_308,
                               (MUFile *)local_308._0_8_);
                  }
                }
              }
              else {
                uVar2 = (this->AutogenTarget).Headers._M_h._M_bucket_count;
                uVar19 = (ulong)pcVar17 % uVar2;
                p_Var20 = (this->AutogenTarget).Headers._M_h._M_buckets[uVar19];
                p_Var18 = (__node_base_ptr)0x0;
                if ((p_Var20 != (__node_base_ptr)0x0) &&
                   (in_R8 = p_Var20->_M_nxt, p_Var18 = p_Var20, p_Var26 = in_R8,
                   pcVar17 != (cmSourceFile *)in_R8[1]._M_nxt)) {
                  while (in_R8 = p_Var26->_M_nxt, in_R8 != (_Hash_node_base *)0x0) {
                    p_Var18 = (__node_base_ptr)0x0;
                    if (((ulong)in_R8[1]._M_nxt % uVar2 != uVar19) ||
                       (p_Var18 = p_Var26, p_Var26 = in_R8,
                       pcVar17 == (cmSourceFile *)in_R8[1]._M_nxt)) goto LAB_00322bb0;
                  }
                  p_Var18 = (__node_base_ptr)0x0;
                }
LAB_00322bb0:
                if ((p_Var18 == (__node_base_ptr)0x0) || (p_Var18->_M_nxt == (_Hash_node_base *)0x0)
                   ) {
                  if (pcVar17->IsGenerated != false) goto LAB_00322bc5;
                  bVar10 = cmsys::SystemTools::FileExists(&local_2d8);
                  if (!bVar10) goto LAB_00322c37;
                  goto LAB_00322bd8;
                }
              }
LAB_00322c37:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                local_2d8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
              operator_delete((void *)local_338._0_8_,
                              (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_338._16_8_)->_M_impl).
                                             super__Vector_impl_data._M_start + 1));
            }
            p_Var33 = local_310 + 0x20;
          } while (p_Var33 !=
                   (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)0x40);
          if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
            operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
          }
        }
        p_Var16 = *(_Base_ptr *)local_2e0;
      } while (p_Var16 != (_Base_ptr)0x0);
    }
    pbVar21 = local_2f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar17 = (cmSourceFile *)
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar35 = (pcVar17->Location).Makefile;
        if (((*(undefined1 *)
               ((long)&(pcVar35->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start + 0x1b) != '\0') ||
            (*(undefined1 *)
              ((long)&(pcVar35->FindPackageRootPathStack).
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start + 0x1c) == '\x01')) &&
           (*(char *)((long)&(pcVar35->FindPackageRootPathStack).
                             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start + 0x18) == '\x01')) {
          local_358._0_8_ = pcVar35;
          std::
          vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>::
          emplace_back<cmQtAutoGenInitializer::MUFile*>
                    ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                      *)&(this->AutogenTarget).FilesGenerated,(MUFile **)local_358);
        }
        std::
        _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                  ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&(this->AutogenTarget).Headers,
                   (_Elt_pointer *)
                   ((long)&(((pcVar17->Location).Makefile)->FindPackageRootPathStack).
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start + 0x10),pcVar17);
        pcVar17 = (cmSourceFile *)&(pcVar17->Location).AmbiguousDirectory;
      } while (pcVar17 != (cmSourceFile *)pbVar21);
    }
    lVar22 = -0x40;
    do {
      if (paVar28 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar28->_M_allocated_capacity)[-2]) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar28->_M_allocated_capacity)[-2],paVar28->_M_allocated_capacity + 1)
        ;
      }
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar28->_M_allocated_capacity + -4);
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::~vector((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_2f8);
    id = extraout_EDX_00;
  }
  if (((this->Moc).super_GenVarsT.Enabled != false) ||
     (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
    ppcVar30 = (local_318->SourceFiles).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar3 = *(pointer *)
               ((long)&(local_318->SourceFiles).
                       super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                       super__Vector_impl_data + 8);
    if (ppcVar30 != ppcVar3) {
      local_310 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   *)&(this->AutogenTarget).Sources;
      local_308._8_8_ = &(this->AutogenTarget).Headers;
      local_2b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  &(this->Uic).FileFiles;
      local_58._0_8_ = &(this->Uic).FileOptions;
      local_2e0 = (_Base_ptr)&(this->Uic).SkipUi;
      do {
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppcVar30;
        local_2a8._8_8_ = (pointer)0x0;
        local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
        local_2a8._0_8_ = (MUFile *)(local_2a8 + 0x10);
        psVar13 = cmSourceFile::GetFullPath
                            ((cmSourceFile *)
                             local_2f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(string *)local_2a8);
        p_Var20 = extraout_RDX;
        if (((pointer)local_2a8._8_8_ == (pointer)0x0) && (psVar13->_M_string_length != 0)) {
          psVar14 = cmSourceFile::GetExtension_abi_cxx11_
                              ((cmSourceFile *)
                               local_2f8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
          FVar11 = cmSystemTools::GetFileFormat(psVar14);
          if (FVar11 == CXX_FILE_FORMAT) {
            in_R8 = (_Hash_node_base *)(this->AutogenTarget).Sources._M_h._M_bucket_count;
            p_Var20 = (this->AutogenTarget).Sources._M_h._M_buckets
                      [(long)((ulong)local_2f8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)];
            p_Var18 = (__node_base_ptr)0x0;
            if ((p_Var20 != (__node_base_ptr)0x0) &&
               (p_Var18 = p_Var20, p_Var27 = p_Var20->_M_nxt,
               (cmSourceFile *)
               local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (cmSourceFile *)p_Var20->_M_nxt[1]._M_nxt)) {
              while (p_Var26 = p_Var27->_M_nxt, p_Var26 != (_Hash_node_base *)0x0) {
                p_Var20 = (__node_base_ptr)((ulong)p_Var26[1]._M_nxt % (ulong)in_R8);
                p_Var18 = (__node_base_ptr)0x0;
                if ((p_Var20 !=
                     (__node_base_ptr)
                     ((ulong)local_2f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)) ||
                   (p_Var18 = p_Var27, p_Var27 = p_Var26,
                   (cmSourceFile *)
                   local_2f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == (cmSourceFile *)p_Var26[1]._M_nxt))
                goto LAB_0032306c;
              }
              p_Var18 = (__node_base_ptr)0x0;
            }
LAB_0032306c:
            if ((p_Var18 == (__node_base_ptr)0x0) || (p_Var18->_M_nxt == (_Hash_node_base *)0x0)) {
              in_R8 = (_Hash_node_base *)0x0;
              InitScanFiles::anon_class_32_4_0bc3998a::operator()
                        ((anon_class_32_4_0bc3998a *)local_358,(cmSourceFile *)local_98,
                         local_2f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar13,0));
              if ((*(bool *)(local_358._0_8_ + 0x29) != false) ||
                 (p_Var20 = extraout_RDX_04, *(bool *)(local_358._0_8_ + 0x2a) == true)) {
                pVar37 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   (local_310,&local_2f8,local_358);
                p_Var20 = pVar37._8_8_;
              }
LAB_003230b7:
              if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)0x0) {
                std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                          ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_358,
                           (MUFile *)local_358._0_8_);
                p_Var20 = extraout_RDX_05;
              }
            }
          }
          else if (FVar11 == HEADER_FILE_FORMAT) {
            in_R8 = (_Hash_node_base *)(this->AutogenTarget).Headers._M_h._M_bucket_count;
            p_Var20 = (this->AutogenTarget).Headers._M_h._M_buckets
                      [(long)((ulong)local_2f8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)];
            p_Var18 = (__node_base_ptr)0x0;
            if ((p_Var20 != (__node_base_ptr)0x0) &&
               (p_Var18 = p_Var20, p_Var27 = p_Var20->_M_nxt,
               (cmSourceFile *)
               local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (cmSourceFile *)p_Var20->_M_nxt[1]._M_nxt)) {
              while (p_Var26 = p_Var27->_M_nxt, p_Var26 != (_Hash_node_base *)0x0) {
                p_Var20 = (__node_base_ptr)((ulong)p_Var26[1]._M_nxt % (ulong)in_R8);
                p_Var18 = (__node_base_ptr)0x0;
                if ((p_Var20 !=
                     (__node_base_ptr)
                     ((ulong)local_2f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start % (ulong)in_R8)) ||
                   (p_Var18 = p_Var27, p_Var27 = p_Var26,
                   (cmSourceFile *)
                   local_2f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == (cmSourceFile *)p_Var26[1]._M_nxt))
                goto LAB_00323019;
              }
              p_Var18 = (__node_base_ptr)0x0;
            }
LAB_00323019:
            if ((p_Var18 == (__node_base_ptr)0x0) || (p_Var18->_M_nxt == (_Hash_node_base *)0x0)) {
              in_R8 = (_Hash_node_base *)0x0;
              InitScanFiles::anon_class_32_4_0bc3998a::operator()
                        ((anon_class_32_4_0bc3998a *)local_358,(cmSourceFile *)local_98,
                         local_2f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar13,0));
              if ((*(bool *)(local_358._0_8_ + 0x29) != false) ||
                 (p_Var20 = extraout_RDX_03, *(bool *)(local_358._0_8_ + 0x2a) == true)) {
                pVar37 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                     *)local_308._8_8_,&local_2f8,local_358);
                p_Var20 = pVar37._8_8_;
              }
              goto LAB_003230b7;
            }
          }
          else {
            p_Var20 = extraout_RDX_00;
            if ((((this->Uic).super_GenVarsT.Enabled == true) &&
                (p_Var20 = (__node_base_ptr)psVar14->_M_string_length, p_Var20 == local_d0)) &&
               ((p_Var20 == (__node_base_ptr)0x0 ||
                (iVar12 = bcmp((psVar14->_M_dataplus)._M_p,local_d8._M_p,(size_t)p_Var20),
                p_Var20 = extraout_RDX_01, iVar12 == 0)))) {
              cmsys::SystemTools::GetRealPath((string *)local_358,psVar13,(string *)0x0);
              bVar9 = cmSourceFile::GetPropertyAsBool
                                ((cmSourceFile *)
                                 local_2f8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,(string *)local_b8);
              if ((bVar9) ||
                 (bVar9 = cmSourceFile::GetPropertyAsBool
                                    ((cmSourceFile *)
                                     local_2f8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(string *)local_f8),
                 bVar9)) {
                pVar36 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string>
                                   ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                     *)local_2e0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_358);
                p_Var20 = pVar36._8_8_;
              }
              else {
                pcVar15 = cmSourceFile::GetSafeProperty
                                    ((cmSourceFile *)
                                     local_2f8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (string *)(local_148 + 0x10));
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)(local_348 + 0x10),pcVar15,(allocator<char> *)&local_2d8);
                p_Var20 = extraout_RDX_06;
                if ((_Elt_pointer)local_338._8_8_ != (_Elt_pointer)0x0) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            (local_2b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_358);
                  local_2d8._M_dataplus._M_p = (pointer)0x0;
                  local_2d8._M_string_length = 0;
                  local_2d8.field_2._M_allocated_capacity = 0;
                  cmSystemTools::ExpandListArgument
                            ((string *)(local_348 + 0x10),
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2d8,false);
                  std::
                  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ::
                  emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              *)local_58._0_8_,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2d8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_2d8);
                  p_Var20 = extraout_RDX_07;
                }
                if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
                  operator_delete((void *)local_338._0_8_,
                                  (ulong)((long)&(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_338._16_8_)->_M_impl).
                                                 super__Vector_impl_data._M_start + 1));
                  p_Var20 = extraout_RDX_08;
                }
              }
              if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
                operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
                p_Var20 = extraout_RDX_02;
              }
            }
          }
        }
        id = (PolicyID)p_Var20;
        if ((MUFile *)local_2a8._0_8_ != (MUFile *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
          id = extraout_EDX_01;
        }
        ppcVar30 = ppcVar30 + 1;
      } while (ppcVar30 != ppcVar3);
    }
  }
  if (((this->Moc).super_GenVarsT.Enabled == false) &&
     (((this->Uic).super_GenVarsT.Enabled & 1U) == 0)) goto LAB_003234bc;
  ppMVar31 = (this->AutogenTarget).FilesGenerated.
             super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppMVar4 = (this->AutogenTarget).FilesGenerated.
            super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar31 == ppMVar4) goto LAB_003234bc;
  if (this->CMP0071Accept == true) {
    if (ppMVar31 != ppMVar4) {
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&(this->AutogenTarget).DependFiles,&(*ppMVar31)->RealPath);
        ppMVar31 = ppMVar31 + 1;
      } while (ppMVar31 != ppMVar4);
    }
    goto LAB_003234bc;
  }
  if (this->CMP0071Warn != true) goto LAB_003234bc;
  local_2a8._0_8_ = local_2a8 + 0x10;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
  cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_358,(cmPolicies *)0x47,id);
  std::__cxx11::string::_M_append(local_2a8,local_358._0_8_);
  if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
    operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
  }
  std::__cxx11::string::push_back((char)local_2a8);
  local_358._8_8_ = (cmQtAutoGenInitializer *)0x0;
  local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
  local_358._0_8_ = (cmMakefile *)local_348;
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    pcVar15 = "SKIP_AUTOGEN";
    if ((this->Uic).super_GenVarsT.Enabled == false) {
      in_R8 = (_Hash_node_base *)&DAT_0000000c;
      std::__cxx11::string::_M_replace((ulong)local_358,0,(char *)0x0,0x4a8190);
    }
    else {
LAB_003232f0:
      std::__cxx11::string::operator=((string *)local_358,pcVar15);
    }
  }
  else {
    pcVar15 = "SKIP_AUTOUIC";
    if ((this->Uic).super_GenVarsT.Enabled == true) goto LAB_003232f0;
  }
  std::__cxx11::string::append(local_2a8);
  rcc = SUB81(in_R8,0);
  ppMVar31 = (this->AutogenTarget).FilesGenerated.
             super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppMVar4 = (this->AutogenTarget).FilesGenerated.
            super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar31 != ppMVar4) {
    do {
      text = *ppMVar31;
      std::__cxx11::string::append(local_2a8);
      cmQtAutoGen::Quoted((string *)(local_348 + 0x10),&text->RealPath);
      std::__cxx11::string::_M_append(local_2a8,local_338._0_8_);
      if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
        operator_delete((void *)local_338._0_8_,
                        (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_338._16_8_)->_M_impl).super__Vector_impl_data.
                                       _M_start + 1));
      }
      std::__cxx11::string::push_back((char)local_2a8);
      rcc = SUB81(in_R8,0);
      ppMVar31 = ppMVar31 + 1;
    } while (ppMVar31 != ppMVar4);
  }
  std::__cxx11::string::append(local_2a8);
  cmQtAutoGen::Tools_abi_cxx11_
            ((string *)(local_348 + 0x10),(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
             (this->Uic).super_GenVarsT.Enabled,false,(bool)rcc);
  std::__cxx11::string::_M_append(local_2a8,local_338._0_8_);
  if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
    operator_delete((void *)local_338._0_8_,
                    (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_338._16_8_)->_M_impl).super__Vector_impl_data._M_start
                           + 1));
  }
  std::__cxx11::string::append(local_2a8);
  std::__cxx11::string::_M_append(local_2a8,local_358._0_8_);
  std::__cxx11::string::append(local_2a8);
  std::__cxx11::string::_M_append(local_2a8,local_358._0_8_);
  std::__cxx11::string::append(local_2a8);
  cmMakefile::IssueMessage(local_318,AUTHOR_WARNING,(string *)local_2a8);
  if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
    operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
  }
  if ((MUFile *)local_2a8._0_8_ != (MUFile *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
LAB_003234bc:
  bVar9 = true;
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_310 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)CONCAT44(local_310._4_4_,(this->QtVersion).Major);
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = this->Target;
    local_358._0_8_ = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"AUTORCC_OPTIONS","");
    pcVar15 = cmGeneratorTarget::GetSafeProperty(this_01,(string *)local_358);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a8,pcVar15,(allocator<char> *)(local_348 + 0x10));
    cmSystemTools::ExpandListArgument((string *)local_2a8,&local_2f8,false);
    if ((MUFile *)local_2a8._0_8_ != (MUFile *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
    }
    if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
    }
    pQVar25 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar5 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar25 != pQVar5) {
      lVar22 = 0;
      pQVar32 = pQVar25;
      do {
        pQVar32->Unique = true;
        pQVar23 = pQVar25;
        lVar24 = lVar22;
        do {
          if (((lVar24 != 0) &&
              (__n = (pQVar32->QrcName)._M_string_length, __n == (pQVar23->QrcName)._M_string_length
              )) && ((__n == 0 ||
                     (iVar12 = bcmp((pQVar32->QrcName)._M_dataplus._M_p,
                                    (pQVar23->QrcName)._M_dataplus._M_p,__n), iVar12 == 0)))) {
            pQVar32->Unique = false;
            break;
          }
          pQVar23 = pQVar23 + 1;
          lVar24 = lVar24 + -0x148;
        } while (pQVar23 != pQVar5);
        pQVar32 = pQVar32 + 1;
        lVar22 = lVar22 + 0x148;
      } while (pQVar32 != pQVar5);
    }
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)local_2a8,local_318);
    pcVar35 = (cmMakefile *)
              (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_308._8_8_ =
         (this->Rcc).Qrcs.
         super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar35 != (cmMakefile *)local_308._8_8_) {
      do {
        cmFilePathChecksum::getPart
                  ((string *)local_358,(cmFilePathChecksum *)local_2a8,
                   (string *)
                   &(pcVar35->FindPackageRootPathStack).
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last,10);
        std::__cxx11::string::operator=
                  ((string *)
                   &(pcVar35->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent,(string *)local_358);
        if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
          operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
        }
        local_358._0_8_ = local_348;
        pcVar6 = (this->Dir).Build._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_358,pcVar6,pcVar6 + (this->Dir).Build._M_string_length);
        std::__cxx11::string::append((char *)local_358);
        std::__cxx11::string::_M_append
                  ((char *)local_358,
                   (ulong)(pcVar35->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header
                          ._M_parent);
        std::__cxx11::string::append((char *)local_358);
        std::__cxx11::string::_M_append
                  ((char *)local_358,
                   (ulong)(pcVar35->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        std::__cxx11::string::append((char *)local_358);
        std::__cxx11::string::operator=
                  ((string *)
                   &(pcVar35->SourceFiles).
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish,(string *)local_358);
        if ((undefined1 *)local_358._0_8_ != local_348) {
          operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
        }
        local_358._0_8_ = local_348;
        pcVar6 = (this->Dir).Info._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_358,pcVar6,pcVar6 + (this->Dir).Info._M_string_length);
        std::__cxx11::string::append((char *)local_358);
        std::__cxx11::string::_M_append
                  (local_358,
                   (ulong)(pcVar35->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        if (*(char *)((long)&(pcVar35->SourceFileSearchIndex)._M_h._M_before_begin._M_nxt + 1) ==
            '\0') {
          std::__cxx11::string::_M_append
                    (local_358,
                     (ulong)(pcVar35->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_parent);
        }
        std::__cxx11::string::_M_assign((string *)pcVar35);
        std::__cxx11::string::append((char *)pcVar35);
        std::__cxx11::string::_M_assign((string *)&pcVar35->Targets);
        std::__cxx11::string::append((char *)&pcVar35->Targets);
        filename = &(pcVar35->Targets)._M_h._M_rehash_policy;
        std::__cxx11::string::_M_assign((string *)filename);
        std::__cxx11::string::append((char *)filename);
        local_318 = pcVar35;
        if (this->MultiConfig == true) {
          __rhs = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pkVar7 = (this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs != pkVar7) {
            do {
              std::operator+(&local_2d8,"_",__rhs);
              cmQtAutoGen::AppendFilenameSuffix
                        ((string *)(local_348 + 0x10),(string *)filename,&local_2d8);
              this_02 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&pcVar35->AliasTargets + 8),__rhs);
              std::__cxx11::string::operator=((string *)this_02,(string *)(local_348 + 0x10));
              if ((MUFile *)local_338._0_8_ != (MUFile *)(local_348 + 0x20)) {
                operator_delete((void *)local_338._0_8_,
                                (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_338._16_8_)->_M_impl).
                                               super__Vector_impl_data._M_start + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                local_2d8.field_2._M_allocated_capacity + 1);
              }
              __rhs = __rhs + 1;
            } while (__rhs != pkVar7);
          }
        }
        if ((cmMakefile *)local_358._0_8_ != (cmMakefile *)local_348) {
          operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
        }
        pcVar35 = (cmMakefile *)
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&local_318->KnownFileSearchIndex + 1);
      } while (pcVar35 != (cmMakefile *)local_308._8_8_);
    }
    lVar22 = -0x100;
    paVar28 = &local_1b8;
    do {
      if (paVar28 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar28->_M_allocated_capacity)[-2]) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar28->_M_allocated_capacity)[-2],paVar28->_M_allocated_capacity + 1)
        ;
      }
      if (&paVar28->_M_allocated_capacity + -4 != (size_type *)(&paVar28->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar28->_M_allocated_capacity)[-6],
                        (&paVar28->_M_allocated_capacity)[-4] + 1);
      }
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar28->_M_allocated_capacity + -8);
      lVar22 = lVar22 + 0x40;
    } while (lVar22 != 0);
    pQVar25 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar5 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar25 != pQVar5) {
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (local_348 + 0x10);
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_358,&local_2f8);
        local_2a8._0_8_ = local_2a8 + 0x10;
        pcVar6 = (pQVar25->QrcName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2a8,pcVar6,pcVar6 + (pQVar25->QrcName)._M_string_length);
        if ((pointer)local_2a8._8_8_ != (pointer)0x0) {
          pbVar21 = (pointer)0x0;
          do {
            if (*(char *)(local_2a8._0_8_ + (long)pbVar21) == '-') {
              *(char *)(local_2a8._0_8_ + (long)pbVar21) = '_';
            }
            pbVar21 = (pointer)((long)&(pbVar21->_M_dataplus)._M_p + 1);
          } while ((pointer)local_2a8._8_8_ != pbVar21);
        }
        if (pQVar25->Unique == false) {
          std::__cxx11::string::append((char *)local_2a8);
          std::__cxx11::string::_M_append
                    ((char *)local_2a8,(ulong)(pQVar25->PathChecksum)._M_dataplus._M_p);
        }
        local_338._0_8_ = (MUFile *)0x0;
        local_338._8_8_ = (_Elt_pointer)0x0;
        local_338._16_8_ = (_Elt_pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>(this_00,(char (*) [6])0x4b7316);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2a8);
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_358,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00,4 < (uint)local_310);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
        if ((MUFile *)local_2a8._0_8_ != (MUFile *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
        }
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_358,&pQVar25->Options,4 < (uint)local_310);
        local_2a8._0_8_ =
             (pQVar25->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2a8._8_8_ =
             (pQVar25->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2a8._16_8_ =
             (pQVar25->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pQVar25->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_358._0_8_;
        (pQVar25->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_358._8_8_;
        (pQVar25->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_348._0_8_;
        local_358._0_8_ = (cmMakefile *)0x0;
        local_358._8_8_ = (cmQtAutoGenInitializer *)0x0;
        local_348._0_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_358);
        pQVar25 = pQVar25 + 1;
      } while (pQVar25 != pQVar5);
    }
    pQVar25 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar5 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar25 != pQVar5) {
      files = &pQVar25->Resources;
      do {
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(files + -2))[1]._M_local_buf[0] == '\0') {
          local_2a8._0_8_ = local_2a8 + 0x10;
          local_2a8._8_8_ = (pointer)0x0;
          local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
          bVar9 = RccListInputs(this,(string *)
                                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)(files + -0xc) + 1),files,(string *)local_2a8);
          if (bVar9) {
            if ((MUFile *)local_2a8._0_8_ != (MUFile *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
            }
          }
          else {
            cmSystemTools::Error((string *)local_2a8);
            if ((MUFile *)local_2a8._0_8_ != (MUFile *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
            }
            if (!bVar9) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_2f8);
              bVar9 = false;
              goto LAB_00323c06;
            }
          }
        }
        pQVar25 = (pointer)(files + 1);
        files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&files[0xd].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (pQVar25 != pQVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    bVar9 = true;
  }
LAB_00323c06:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  if (local_158 != (pointer)local_148) {
    operator_delete(local_158,(ulong)(local_148._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((pointer *)local_58._8_8_ != local_40) {
    operator_delete((void *)local_58._8_8_,(long)local_40[0] + 1);
  }
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
  }
  return bVar9;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();

  // String constants
  std::string const SKIP_AUTOGEN_str = "SKIP_AUTOGEN";
  std::string const SKIP_AUTOMOC_str = "SKIP_AUTOMOC";
  std::string const SKIP_AUTOUIC_str = "SKIP_AUTOUIC";
  std::string const SKIP_AUTORCC_str = "SKIP_AUTORCC";
  std::string const AUTOUIC_OPTIONS_str = "AUTOUIC_OPTIONS";
  std::string const AUTORCC_OPTIONS_str = "AUTORCC_OPTIONS";
  std::string const qrc_str = "qrc";
  std::string const ui_str = "ui";

  auto makeMUFile = [&](cmSourceFile* sf, std::string const& fullPath,
                        bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->RealPath = cmSystemTools::GetRealPath(fullPath);
    muf->SF = sf;
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(SKIP_AUTOGEN_str);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOMOC_str));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOUIC_str));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUFile = [&](MUFileHandle&& muf, bool isHeader) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    if (isHeader) {
      this->AutogenTarget.Headers.emplace(muf->SF, std::move(muf));
    } else {
      this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
    }
  };

  // Scan through target files
  {
    // Scan through target files
    std::vector<cmSourceFile*> srcFiles;
    this->Target->GetConfigCommonSourceFiles(srcFiles);
    for (cmSourceFile* sf : srcFiles) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        switch (cmSystemTools::GetFileFormat(ext)) {
          case cmSystemTools::HEADER_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), true);
            break;
          case cmSystemTools::CXX_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), false);
            break;
          default:
            break;
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((ext == qrc_str) && !sf->GetPropertyAsBool(SKIP_AUTOGEN_str) &&
            !sf->GetPropertyAsBool(SKIP_AUTORCC_str)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = cmSystemTools::GetRealPath(fullPath);
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = sf->GetIsGenerated();
          // RCC options
          {
            std::string const opts = sf->GetSafeProperty(AUTORCC_OPTIONS_str);
            if (!opts.empty()) {
              cmSystemTools::ExpandListArgument(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetConfigCommonSourceFiles computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->Target->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    std::vector<MUFileHandle> extraHeaders;
    extraHeaders.reserve(this->AutogenTarget.Sources.size() * 2);
    // Header search suffixes and extensions
    std::array<std::string, 2> const suffixes{ { "", "_p" } };
    auto const& exts = makefile->GetCMakeInstance()->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& realPath = muf.RealPath;
        std::string basePath = cmQtAutoGen::SubDirPrefix(realPath);
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(realPath);
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = basePath + suffix;
          for (auto const& ext : exts) {
            std::string fullPath = suffixedPath;
            fullPath += '.';
            fullPath += ext;

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf = makefile->GetSource(fullPath, locationKind);
            if (sf != nullptr) {
              // Check if we know about this header already
              if (this->AutogenTarget.Headers.find(sf) !=
                  this->AutogenTarget.Headers.end()) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf != nullptr) {
              auto eMuf = makeMUFile(sf, fullPath, true);
              // Ony process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              extraHeaders.emplace_back(std::move(eMuf));
            }
          }
        }
      }
    }
    // Move generated files to main headers list
    for (auto& eMuf : extraHeaders) {
      addMUFile(std::move(eMuf), true);
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (cmSourceFile* sf : makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      auto const fileFormat = cmSystemTools::GetFileFormat(ext);
      if (fileFormat == cmSystemTools::HEADER_FILE_FORMAT) {
        if (this->AutogenTarget.Headers.find(sf) ==
            this->AutogenTarget.Headers.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Headers.emplace(sf, std::move(muf));
          }
        }
      } else if (fileFormat == cmSystemTools::CXX_FILE_FORMAT) {
        if (this->AutogenTarget.Sources.find(sf) ==
            this->AutogenTarget.Sources.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Sources.emplace(sf, std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (ext == ui_str)) {
        // .ui file
        std::string realPath = cmSystemTools::GetRealPath(fullPath);
        bool const skipAutogen = sf->GetPropertyAsBool(SKIP_AUTOGEN_str);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOUIC_str));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(AUTOUIC_OPTIONS_str);
          if (!uicOpts.empty()) {
            this->Uic.FileFiles.push_back(std::move(realPath));
            std::vector<std::string> optsVec;
            cmSystemTools::ExpandListArgument(uicOpts, optsVec);
            this->Uic.FileOptions.push_back(std::move(optsVec));
          }
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(std::move(realPath));
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->RealPath);
      }
    } else if (this->CMP0071Warn) {
      std::string msg;
      msg += cmPolicies::GetPolicyWarning(cmPolicies::CMP0071);
      msg += '\n';
      std::string property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = "SKIP_AUTOGEN";
      } else if (this->Moc.Enabled) {
        property = "SKIP_AUTOMOC";
      } else if (this->Uic.Enabled) {
        property = "SKIP_AUTOUIC";
      }
      msg += "For compatibility, CMake is excluding the GENERATED source "
             "file(s):\n";
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        msg += "  ";
        msg += Quoted(muf->RealPath);
        msg += '\n';
      }
      msg += "from processing by ";
      msg += cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false);
      msg += ". If any of the files should be processed, set CMP0071 to NEW. "
             "If any of the files should not be processed, "
             "explicitly exclude them by setting the source file property ";
      msg += property;
      msg += ":\n  set_property(SOURCE file.h PROPERTY ";
      msg += property;
      msg += " ON)\n";
      makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
    }
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget;
    cmSystemTools::ExpandListArgument(
      this->Target->GetSafeProperty("AUTORCC_OPTIONS"), optionsTarget);

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      for (Qrc& qrc : this->Rcc.Qrcs) {
        qrc.PathChecksum = fpathCheckSum.getPart(qrc.QrcFile);
        // RCC output file name
        {
          std::string rccFile = this->Dir.Build + "/";
          rccFile += qrc.PathChecksum;
          rccFile += "/qrc_";
          rccFile += qrc.QrcName;
          rccFile += ".cpp";
          qrc.RccFile = std::move(rccFile);
        }
        {
          std::string base = this->Dir.Info;
          base += "/RCC";
          base += qrc.QrcName;
          if (!qrc.Unique) {
            base += qrc.PathChecksum;
          }

          qrc.LockFile = base;
          qrc.LockFile += ".lock";

          qrc.InfoFile = base;
          qrc.InfoFile += "Info.cmake";

          qrc.SettingsFile = base;
          qrc.SettingsFile += "Settings.txt";

          if (this->MultiConfig) {
            for (std::string const& cfg : this->ConfigsList) {
              qrc.ConfigSettingsFile[cfg] =
                AppendFilenameSuffix(qrc.SettingsFile, "_" + cfg);
            }
          }
        }
      }
    }
    // RCC options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += "_";
          name += qrc.PathChecksum;
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // RCC resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        if (!RccListInputs(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}